

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char16_t value,
          basic_format_specs<char16_t> *specs,locale_ref loc)

{
  basic_format_specs<char16_t> *specs_00;
  locale_ref loc_00;
  locale_ref out_00;
  bool bVar1;
  write_int_arg<unsigned_int> arg;
  error_handler local_71;
  basic_format_specs<char16_t> *local_70;
  basic_format_specs<char16_t> *specs_local;
  locale_ref lStack_60;
  char16_t value_local;
  locale_ref loc_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  
  local_70 = specs;
  specs_local._6_2_ = value;
  lStack_60.locale_ = loc.locale_;
  loc_local.locale_ = out.container;
  bVar1 = check_char_specs<char16_t,fmt::v8::detail::error_handler>(specs,&local_71);
  out_00.locale_ = loc_local.locale_;
  loc_00 = lStack_60;
  specs_00 = local_70;
  if (bVar1) {
    out_local = write_char<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                          ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)
                           loc_local.locale_,specs_local._6_2_,local_70);
  }
  else {
    arg = make_write_int_arg<int>
                    ((uint)(ushort)specs_local._6_2_,
                     (uint)(*(ushort *)&local_70->field_0x9 >> 4 & 7));
    out_local = write_int_noinline<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>
                          ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out_00.locale_,
                           arg,specs_00,loc_00);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}